

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

float32 propagateFloat32NaN(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = 2;
  bVar5 = 2;
  if (0x7f800000 < (a & 0x7fffffff)) {
    bVar5 = ((a & 0x3fffff) == 0 || (a & 0x7fc00000) != 0x7f800000) ^ 5;
  }
  if (0x7f800000 < (b & 0x7fffffff)) {
    bVar4 = ((b & 0x3fffff) == 0 || (b & 0x7fc00000) != 0x7f800000) ^ 5;
  }
  if ((bVar5 == 5) || (bVar4 == 5)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode != '\0') {
    return 0x7fc00000;
  }
  bVar2 = a * 2 < b * 2 || b <= a && a * 2 <= b * 2;
  if (bVar5 == 4) {
    if (bVar4 == 5) goto LAB_00d00406;
    bVar1 = bVar4 == 4 && bVar2;
  }
  else {
    if (bVar5 != 5) goto LAB_00d003f8;
    bVar1 = bVar4 == 4;
    if (bVar4 == 5) {
      bVar1 = bVar2;
    }
  }
  if (!bVar1) {
LAB_00d00406:
    uVar3 = a | 0x400000;
    if (bVar5 != 5) {
      uVar3 = a;
    }
    return uVar3;
  }
LAB_00d003f8:
  uVar3 = b | 0x400000;
  if (bVar4 != 5) {
    uVar3 = b;
  }
  return uVar3;
}

Assistant:

static float32 propagateFloat32NaN(float32 a, float32 b, float_status *status)
{
    flag aIsLargerSignificand;
    uint32_t av, bv;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float32_is_any_nan(a)
             ? float_class_normal
             : float32_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float32_is_any_nan(b)
             ? float_class_normal
             : float32_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    av = float32_val(a);
    bv = float32_val(b);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float32_default_nan(status);
    }

    if ((uint32_t)(av << 1) < (uint32_t)(bv << 1)) {
        aIsLargerSignificand = 0;
    } else if ((uint32_t)(bv << 1) < (uint32_t)(av << 1)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (av < bv) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float32_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float32_silence_nan(a, status);
        }
        return a;
    }
}